

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::ZeroCopyCodedInputStream::ReadCord
          (ZeroCopyCodedInputStream *this,Cord *cord,int count)

{
  bool bVar1;
  undefined1 local_38 [7];
  bool res;
  Cord tmp;
  int count_local;
  Cord *cord_local;
  ZeroCopyCodedInputStream *this_local;
  
  tmp.contents_.data_.rep_.field_0._12_4_ = count;
  bVar1 = absl::lts_20250127::Cord::empty(cord);
  if (bVar1) {
    this_local._7_1_ =
         io::CodedInputStream::ReadCord(this->cis_,cord,tmp.contents_.data_.rep_.field_0._12_4_);
  }
  else {
    absl::lts_20250127::Cord::Cord((Cord *)local_38);
    this_local._7_1_ =
         io::CodedInputStream::ReadCord
                   (this->cis_,(Cord *)local_38,tmp.contents_.data_.rep_.field_0._12_4_);
    absl::lts_20250127::Cord::Append(cord,(Cord *)local_38);
    absl::lts_20250127::Cord::~Cord((Cord *)local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool ReadCord(absl::Cord* cord, int count) final {
    // Fast path: tail call into ReadCord reading new value.
    if (ABSL_PREDICT_TRUE(cord->empty())) {
      return cis_->ReadCord(cord, count);
    }
    absl::Cord tmp;
    bool res = cis_->ReadCord(&tmp, count);
    cord->Append(std::move(tmp));
    return res;
  }